

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::Y_formatter<spdlog::details::null_scoped_padder>::format
          (Y_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  memory_buf_t *in_RCX;
  memory_buf_t *in_RDI;
  int unaff_retaddr;
  null_scoped_padder p;
  size_t field_size;
  null_scoped_padder local_29;
  undefined8 local_28;
  
  local_28 = 4;
  null_scoped_padder::null_scoped_padder
            (&local_29,4,(padding_info *)&(in_RDI->super_buffer<char>).ptr_,in_RCX);
  fmt_helper::append_int<int>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 4;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }